

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cc
# Opt level: O2

string * removeIUPAC(string *__return_storage_ptr__,string *sequence)

{
  uint uVar1;
  pointer pcVar2;
  ulong uVar3;
  ulong uVar4;
  byte bVar5;
  
  uVar1 = (uint)sequence->_M_string_length;
  uVar4 = 0;
  uVar3 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar3 = uVar4;
  }
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    pcVar2 = (sequence->_M_dataplus)._M_p;
    bVar5 = pcVar2[uVar4] + 0xbe;
    if ((bVar5 < 0x18) && ((0xb31a45U >> (bVar5 & 0x1f) & 1) != 0)) {
      pcVar2[uVar4] = (&DAT_00126b63)[bVar5];
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)sequence);
  return __return_storage_ptr__;
}

Assistant:

std::string removeIUPAC(std::string sequence){
    int n = sequence.length();
    for(int i = 0; i<n; ++i){
        if(sequence[i] == 'R') sequence[i] = 'G';
        else if(sequence[i] == 'Y') sequence[i] = 'C';
        else if (sequence[i] == 'S') sequence[i] = 'G';
        else if (sequence[i] == 'W') sequence[i] = 'A';
        else if (sequence[i] == 'K') sequence[i] = 'T';
        else if (sequence[i] == 'M') sequence[i] = 'A';
        else if (sequence[i] == 'B') sequence[i] = 'C';
        else if (sequence[i] == 'D') sequence[i] = 'T';
        else if (sequence[i] == 'H') sequence[i] = 'A';
        else if (sequence[i] == 'V') sequence[i] = 'G';
        else if (sequence[i] == 'N') sequence[i] = 'A';

    }
    return sequence;
}